

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int get_segctl_physical_address
              (CPUMIPSState_conflict5 *env,hwaddr *physical,int *prot,target_ulong real_address,
              int rw,int access_type,int mmu_idx,uint16_t segctl,target_ulong segmask)

{
  int iVar1;
  hwaddr in_RAX;
  undefined6 in_stack_00000012;
  
  iVar1 = get_seg_physical_address
                    (env,physical,prot,real_address,rw,access_type,(uint)mmu_idx >> 4 & 7,
                     (mmu_idx & 8U) >> 3,SUB21(segctl,0),
                     ~CONCAT62(in_stack_00000012,segctl) & (ulong)(mmu_idx & 0xfe00) << 0x14,in_RAX)
  ;
  return iVar1;
}

Assistant:

static int get_segctl_physical_address(CPUMIPSState *env, hwaddr *physical,
                                       int *prot, target_ulong real_address,
                                       int rw, int access_type, int mmu_idx,
                                       uint16_t segctl, target_ulong segmask)
{
    unsigned int am = (segctl & CP0SC_AM_MASK) >> CP0SC_AM;
    bool eu = (segctl >> CP0SC_EU) & 1;
    hwaddr pa = ((hwaddr)segctl & CP0SC_PA_MASK) << 20;

    return get_seg_physical_address(env, physical, prot, real_address, rw,
                                    access_type, mmu_idx, am, eu, segmask,
                                    pa & ~(hwaddr)segmask);
}